

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_plu_p(matd_plu_t *mlu)

{
  uint uVar1;
  uint uVar2;
  matd_t *pmVar3;
  matd_t *pmVar4;
  uint local_24;
  int i;
  matd_t *P;
  matd_t *lu;
  matd_plu_t *mlu_local;
  
  pmVar3 = mlu->lu;
  pmVar4 = matd_create(pmVar3->nrows,pmVar3->nrows);
  for (local_24 = 0; local_24 < pmVar3->nrows; local_24 = local_24 + 1) {
    uVar1 = mlu->piv[(int)local_24];
    uVar2 = pmVar4->ncols;
    pmVar4[(ulong)(uVar1 * uVar2 + local_24) + 1].nrows = 0;
    pmVar4[(ulong)(uVar1 * uVar2 + local_24) + 1].ncols = 0x3ff00000;
  }
  return pmVar4;
}

Assistant:

matd_t *matd_plu_p(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    matd_t *P = matd_create(lu->nrows, lu->nrows);

    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(P, mlu->piv[i], i) = 1;
    }

    return P;
}